

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void parse_num(void)

{
  bool bVar1;
  ushort **ppuVar2;
  char *pcVar3;
  int width_found;
  int sign_found;
  int len;
  char *p;
  char suffix [9];
  long fp;
  int bc;
  int bl;
  int overflow_16;
  int overflow_8;
  int digit;
  int base;
  int in_stack_ffffffffffffffc0;
  int iVar4;
  int local_3c;
  char *local_38;
  char local_29 [9];
  long local_20;
  uint local_18;
  uint local_14;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_4 = 10;
  local_c = 0;
  local_10 = 0;
  if (c == 0x30) {
    t.constant = 0;
    local_4 = 8;
    if ((l == 0x78) || (l == 0x58)) {
      local_14 = line;
      local_18 = column;
      local_20 = ftell((FILE *)f);
      local_4 = 0x10;
      readbyte();
      ppuVar2 = __ctype_b_loc();
      if (((((*ppuVar2)[l] & 0x800) == 0) && ((l < 0x61 || (0x66 < l)))) &&
         ((l < 0x41 || (0x46 < l)))) {
        fseek((FILE *)f,local_20,0);
        l = c;
        line = local_14;
        column = local_18;
      }
    }
  }
  else {
    t.constant = c - 0x30;
  }
  while (local_8 = get_digit(in_stack_ffffffffffffffc0), local_8 != -1) {
    t.constant = local_8 + local_4 * t.constant;
    if (0xff < t.constant) {
      local_c = 1;
    }
    if (0xffff < t.constant) {
      local_10 = 1;
    }
  }
  ppuVar2 = __ctype_b_loc();
  if ((((*ppuVar2)[l] & 0x400) != 0) || (l == 0x5f)) {
    local_3c = 1;
    iVar4 = 0;
    bVar1 = false;
    readbyte();
    local_29[0] = (char)c;
    local_38 = local_29 + 1;
    while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[l] & 8) != 0) {
      readbyte();
      if (local_3c < 8) {
        *local_38 = (char)c;
        local_3c = local_3c + 1;
        local_38 = local_38 + 1;
      }
    }
    *local_38 = '\0';
    for (local_38 = local_29; *local_38 != '\0'; local_38 = local_38 + 1) {
      if ((*local_38 == 'u') || (*local_38 == 'U')) {
        if (iVar4 != 0) goto LAB_00104029;
        t._unsigned = 1;
        iVar4 = 1;
      }
      else {
        if (((*local_38 != 'w') && (*local_38 != 'W')) || (bVar1)) {
LAB_00104029:
          pcVar3 = "";
          if (local_3c == 8) {
            pcVar3 = "...";
          }
          err(E,"invalid suffix \"%s%s\" after integer constant",local_29,pcVar3);
          return;
        }
        t._word = 1;
        bVar1 = true;
      }
    }
  }
  if (t._word == 0) {
    if ((t._unsigned == 0) && (0x7f < t.constant)) {
      t._unsigned = 1;
    }
    if (local_c != 0) {
      t._unsigned = 1;
      t.constant = t.constant & 0xff;
      err(W,"numeric constant is too large for its type");
    }
  }
  else {
    if ((t._unsigned == 0) && (0x7fff < t.constant)) {
      t._unsigned = 1;
    }
    if (local_10 != 0) {
      t._unsigned = 1;
      t.constant = t.constant & 0xffff;
      err(W,"numeric constant is too large for its type");
    }
  }
  return;
}

Assistant:

void parse_num()
{
    int base = 10;
    int digit;
    int overflow_8 = 0;
    int overflow_16 = 0;

    if (c == '0')
    {
        t.constant = 0;
        base = 8;

        if (l == 'x' || l == 'X')
        {
            int bl = line;
            int bc = column;
            long fp = ftell(f);

            base = 16;
            readbyte();

            if ( ! (isdigit(l)
                   || (l >= 'a' && l <= 'f')
                   || (l >= 'A' && l <= 'F'))
               )
            {
                fseek(f, fp, SEEK_SET);
                l = c;
                line = bl;
                column = bc;
            }
        }
    }
    else
        t.constant = c - '0';

    while ( (digit = get_digit(base)) != -1 )
    {
        t.constant *= base;
        t.constant += digit;

        /* If the constant does not fit into an unsigned int and overflows,
        the value may later seem to fit into our "byte" or "word" */
        if (t.constant > 0xFF)
            overflow_8 = 1;
        if (t.constant > 0xFFFF)
            overflow_16 = 1;
    }

    /* eat up all alpha/underscore characters as a part of the suffix in order
     to not treat them as an identifier */
    if (isalpha(l) || l == '_')
    {
        char suffix[9];
        char* p = suffix;
        int len = 1;
        int sign_found = 0;     /* U suffix */
        int width_found = 0;    /* W suffix */

        readbyte();
        *p++ = c;
        while (isalnum(l))
        {
            readbyte();
            if (len < 8)
            {
                *p++ = c;
                ++len;
            }
        }
        *p = 0;

        p = suffix;
        while (*p)
        {
            if (*p == 'u' || *p == 'U')
            {
                if (sign_found)
                    goto suffix_error;
                t._unsigned = 1;
                sign_found = 1;
            }
            else if (*p == 'w' || *p == 'W')
            {
                if (width_found)
                    goto suffix_error;
                t._word = 1;
                width_found = 1;
            }
            else
                goto suffix_error;

            ++p;
            continue;

        suffix_error:
            err(E, "invalid suffix \"%s%s\" after integer constant", suffix, len == 8 ? "..." : "");
            return;
        }
    }

    if (!t._word)
    {
        if (!t._unsigned && t.constant > 127)
            t._unsigned = 1;

        if (overflow_8)
        {
            t._unsigned = 1;
            t.constant &= 0xFF;
            err(W, "numeric constant is too large for its type");
        }
    }
    else
    {
        if (!t._unsigned && t.constant > 32767)
            t._unsigned = 1;

        if (overflow_16)
        {
            t._unsigned = 1;
            t.constant &= 0xFFFF;
            err(W, "numeric constant is too large for its type");
        }
    }



}